

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * __thiscall
choc::text::FloatToStringBuffer<float>::writeShortInteger
          (FloatToStringBuffer<float> *this,char *dest,int n)

{
  FloatToStringBuffer<float> *this_00;
  int n_00;
  undefined4 in_register_00000014;
  int iVar1;
  int n_local;
  char *dest_local;
  
  iVar1 = (int)dest;
  if (iVar1 < 0) {
    this_00 = (FloatToStringBuffer<float> *)
              write((int)this,(void *)0x2d,CONCAT44(in_register_00000014,n));
    dest_local = writeShortInteger(this_00,(char *)(ulong)(uint)-iVar1,n_00);
  }
  else if (iVar1 < 100) {
    if (iVar1 < 10) {
      dest_local = writeDigit(this,(char *)((ulong)dest & 0xffffffff),n);
    }
    else {
      dest_local = writeDigit<int>(this->storage,iVar1 / 10,iVar1 % 10);
    }
  }
  else {
    dest_local = writeDigit<int,int>(this->storage,iVar1 / 100,
                                     (int)((long)((ulong)(uint)((int)((long)iVar1 / 10) >> 0x1f) <<
                                                  0x20 | (long)iVar1 / 10 & 0xffffffffU) % 10),
                                     iVar1 % 10);
  }
  return dest_local;
}

Assistant:

[[nodiscard]] static char* writeShortInteger (char* dest, int n)
    {
        if (n < 0)    return writeShortInteger (write (dest, '-'), -n);
        if (n >= 100) return writeDigit (dest, n / 100, (n / 10) % 10, n % 10);
        if (n >= 10)  return writeDigit (dest, n / 10,  n % 10);

        return writeDigit (dest, n);
    }